

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Containers.h
# Opt level: O3

uint anon_unknown.dwarf_55c6a2::nearestPowerOfTwo(uint v)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = v - 1 >> 1 | v - 1;
  uVar1 = uVar1 >> 2 | uVar1;
  uVar1 = uVar1 >> 4 | uVar1;
  uVar1 = uVar1 >> 8 | uVar1;
  uVar2 = (uVar1 >> 0x10 | uVar1) + 1;
  uVar1 = v >> 1 | v;
  uVar1 = uVar1 >> 2 | uVar1;
  uVar1 = uVar1 >> 4 | uVar1;
  uVar1 = uVar1 >> 8 | uVar1;
  uVar1 = (uVar1 >> 0x10 | uVar1) + 1 >> 1;
  if (uVar2 - v <= v - uVar1) {
    uVar1 = uVar2;
  }
  return uVar1;
}

Assistant:

inline uint nextPowerOfTwo( uint x )
	{
		nvDebugCheck( x != 0 );
	#if 1	// On modern CPUs this is as fast as using the bsr instruction.
		x--;
		x |= x >> 1;
		x |= x >> 2;
		x |= x >> 4;
		x |= x >> 8;
		x |= x >> 16;
		return x+1;	
	#else
		uint p = 1;
		while( x > p ) {
			p += p;
		}
		return p;
	#endif
	}